

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.cpp
# Opt level: O0

value_ptr __thiscall pstore::dump::make_value(dump *this,digest *d)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar1;
  string local_38 [8];
  string str;
  digest *d_local;
  
  std::__cxx11::string::string(local_38);
  out = std::back_inserter<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  uint128::to_hex<std::back_insert_iterator<std::__cxx11::string>>(d,out);
  make_value(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (index::digest const & d) {
            std::string str;
            d.to_hex (std::back_inserter (str));
            return make_value (str);
        }